

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_uri_boolean(char *zFilename,char *zParam,int bDflt)

{
  char *z_00;
  byte dflt;
  uint local_2c;
  char *z;
  int bDflt_local;
  char *zParam_local;
  char *zFilename_local;
  
  z_00 = sqlite3_uri_parameter(zFilename,zParam);
  dflt = bDflt != 0;
  if (z_00 != (char *)0x0) {
    dflt = sqlite3GetBoolean(z_00,dflt);
  }
  local_2c = (uint)dflt;
  return local_2c;
}

Assistant:

SQLITE_API int sqlite3_uri_boolean(const char *zFilename, const char *zParam, int bDflt){
  const char *z = sqlite3_uri_parameter(zFilename, zParam);
  bDflt = bDflt!=0;
  return z ? sqlite3GetBoolean(z, bDflt) : bDflt;
}